

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

void __thiscall rpc_tests::help_example::test_method(help_example *this)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_02;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_03;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_04;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_05;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_06;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_07;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_08;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_09;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_10;
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffe6d8;
  char *in_stack_ffffffffffffe6e0;
  char *in_stack_ffffffffffffe6e8;
  undefined4 in_stack_ffffffffffffe6f0;
  VType in_stack_ffffffffffffe6f4;
  UniValue *in_stack_ffffffffffffe6f8;
  const_string *in_stack_ffffffffffffe700;
  size_t in_stack_ffffffffffffe708;
  UniValue *in_stack_ffffffffffffe710;
  UniValue *in_stack_ffffffffffffe718;
  iterator in_stack_ffffffffffffe720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe728;
  string *in_stack_ffffffffffffe730;
  undefined1 *local_1710;
  undefined1 *local_16f8;
  undefined1 *local_16a8;
  undefined1 *local_1690;
  undefined1 *local_1640;
  undefined1 *local_1600;
  undefined1 *local_15b8;
  undefined1 *local_1578;
  undefined1 *local_1518;
  undefined1 *local_14d8;
  undefined1 *local_1498;
  long *local_1420;
  RPCArgList *args;
  help_example *this_local;
  allocator<char> local_126b [2];
  undefined1 local_1269;
  allocator<char> local_1249;
  undefined1 local_1248 [16];
  undefined1 local_1238 [101];
  allocator<char> local_11d3 [2];
  undefined1 local_11d1;
  allocator<char> local_11b1;
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [103];
  allocator<char> local_1139;
  undefined1 local_1138 [16];
  undefined1 local_1128 [103];
  allocator<char> local_10c1;
  undefined1 local_10c0 [16];
  undefined1 local_10b0 [64];
  undefined4 local_1070;
  undefined1 local_106a;
  allocator<char> local_1049;
  undefined1 local_1048 [16];
  undefined1 local_1038 [56];
  undefined8 local_1000;
  allocator<char> local_fd1;
  undefined1 local_fd0 [16];
  undefined1 local_fc0 [68];
  undefined4 local_f7c;
  allocator<char> local_f75;
  undefined1 local_f74;
  allocator<char> local_f73;
  allocator<char> local_f72 [33];
  allocator<char> local_f51;
  undefined1 local_f50 [16];
  undefined1 local_f40 [103];
  allocator<char> local_ed9;
  undefined1 local_ed8 [16];
  undefined1 local_ec8 [103];
  allocator<char> local_e61;
  undefined1 local_e60 [16];
  undefined1 local_e50 [71];
  allocator<char> local_e09;
  undefined1 local_e08 [16];
  undefined1 local_df8 [71];
  allocator<char> local_db1;
  undefined1 local_db0 [16];
  undefined1 local_da0 [72];
  undefined4 local_d58;
  undefined1 local_d51;
  undefined1 local_d38 [120];
  undefined1 local_cc0 [32];
  lazy_ostream local_ca0 [2];
  undefined1 local_c80 [120];
  undefined1 local_c08 [32];
  undefined1 local_be8 [32];
  undefined1 local_bc8 [120];
  undefined1 local_b50 [32];
  lazy_ostream local_b30 [2];
  undefined1 local_b10 [120];
  undefined1 local_a98 [32];
  undefined1 local_a78 [32];
  undefined1 local_a58 [120];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [120];
  undefined1 local_928 [32];
  undefined1 local_908 [328];
  UniValue arr_value;
  undefined1 local_768 [120];
  undefined1 local_6f0 [32];
  undefined1 local_6d0 [32];
  undefined1 local_6b0 [120];
  undefined1 local_638 [32];
  undefined1 local_618 [424];
  UniValue obj_value;
  undefined1 local_418 [120];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [120];
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [120];
  undefined1 local_230 [32];
  undefined1 local_210 [64];
  undefined1 local_1d0 [64];
  undefined1 local_190 [32];
  long local_170 [45];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_const_char_(&)[4],_true>
            (in_stack_ffffffffffffe720,(char (*) [4])in_stack_ffffffffffffe718,
             (char (*) [4])in_stack_ffffffffffffe710);
  local_d51 = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[2],_bool,_true>
            (in_stack_ffffffffffffe720,(char (*) [2])in_stack_ffffffffffffe718,
             (bool *)in_stack_ffffffffffffe710);
  local_d58 = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[2],_int,_true>
            (in_stack_ffffffffffffe720,(char (*) [2])in_stack_ffffffffffffe718,
             (int *)in_stack_ffffffffffffe710);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
               *)in_stack_ffffffffffffe6d8);
  __l._M_len = (size_type)in_stack_ffffffffffffe728;
  __l._M_array = in_stack_ffffffffffffe720;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)in_stack_ffffffffffffe718,__l,(allocator_type *)in_stack_ffffffffffffe710);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                *)in_stack_ffffffffffffe6d8);
  local_1420 = &local_8;
  do {
    local_1420 = local_1420 + -0xf;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
             *)in_stack_ffffffffffffe6d8);
  } while (local_1420 != local_170);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe718,
               (const_string *)in_stack_ffffffffffffe710,in_stack_ffffffffffffe708,
               in_stack_ffffffffffffe700);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6e0,(char (*) [1])in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
               (allocator<char> *)in_stack_ffffffffffffe718);
    HelpExampleCliNamed(in_stack_ffffffffffffe730,(RPCArgList *)in_stack_ffffffffffffe728);
    in_stack_ffffffffffffe6e8 = "\"> bitcoin-cli -named test foo=bar b=true n=1\\n\"";
    in_stack_ffffffffffffe6e0 = "> bitcoin-cli -named test foo=bar b=true n=1\n";
    in_stack_ffffffffffffe6d8 = "HelpExampleCliNamed(\"test\", args)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[46]>
              (local_da0,local_db0,0x22c,1,2,local_190);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::allocator<char>::~allocator(&local_db1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe718,
               (const_string *)in_stack_ffffffffffffe710,in_stack_ffffffffffffe708,
               in_stack_ffffffffffffe700);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6e0,(char (*) [1])in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
               (allocator<char> *)in_stack_ffffffffffffe718);
    HelpExampleRpcNamed(&in_stack_ffffffffffffe720->first,(RPCArgList *)in_stack_ffffffffffffe718);
    in_stack_ffffffffffffe6e8 =
         "\"> curl --user myusername --data-binary \'{\\\"jsonrpc\\\": \\\"2.0\\\", \\\"id\\\": \\\"curltest\\\", \\\"method\\\": \\\"test\\\", \\\"params\\\": {\\\"foo\\\":\\\"bar\\\",\\\"b\\\":true,\\\"n\\\":1}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\\n\""
    ;
    in_stack_ffffffffffffe6e0 =
         "> curl --user myusername --data-binary \'{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"foo\":\"bar\",\"b\":true,\"n\":1}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\n"
    ;
    in_stack_ffffffffffffe6d8 = "HelpExampleRpcNamed(\"test\", args)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[196]>
              (local_df8,local_e08,0x22d,1,2,local_1d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::allocator<char>::~allocator(&local_e09);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe718,
               (const_string *)in_stack_ffffffffffffe710,in_stack_ffffffffffffe708,
               in_stack_ffffffffffffe700);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6e0,(char (*) [1])in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
               (allocator<char> *)in_stack_ffffffffffffe718);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::pair<const_char_(&)[4],_const_char_(&)[5],_true>
              (in_stack_ffffffffffffe720,(char (*) [4])in_stack_ffffffffffffe718,
               (char (*) [5])in_stack_ffffffffffffe710);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                 *)in_stack_ffffffffffffe6d8);
    __l_00._M_len = (size_type)in_stack_ffffffffffffe728;
    __l_00._M_array = in_stack_ffffffffffffe720;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              *)in_stack_ffffffffffffe718,__l_00,(allocator_type *)in_stack_ffffffffffffe710);
    HelpExampleCliNamed(in_stack_ffffffffffffe730,(RPCArgList *)in_stack_ffffffffffffe728);
    in_stack_ffffffffffffe6e8 = "\"> bitcoin-cli -named test foo=\'b\'\'\'ar\'\\n\"";
    in_stack_ffffffffffffe6e0 = "> bitcoin-cli -named test foo=\'b\'\'\'ar\'\n";
    in_stack_ffffffffffffe6d8 = "HelpExampleCliNamed(\"test\", {{\"foo\", \"b\'ar\"}})";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[40]>
              (local_e50,local_e60,0x230,1,2,local_210);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *)in_stack_ffffffffffffe6e8);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                  *)in_stack_ffffffffffffe6d8);
    local_1498 = local_230;
    do {
      local_1498 = local_1498 + -0x78;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
               *)in_stack_ffffffffffffe6d8);
    } while (local_1498 != local_2a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::allocator<char>::~allocator(&local_e61);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe718,
               (const_string *)in_stack_ffffffffffffe710,in_stack_ffffffffffffe708,
               in_stack_ffffffffffffe700);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6e0,(char (*) [1])in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
               (allocator<char> *)in_stack_ffffffffffffe718);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::pair<const_char_(&)[4],_const_char_(&)[5],_true>
              (in_stack_ffffffffffffe720,(char (*) [4])in_stack_ffffffffffffe718,
               (char (*) [5])in_stack_ffffffffffffe710);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                 *)in_stack_ffffffffffffe6d8);
    __l_01._M_len = (size_type)in_stack_ffffffffffffe728;
    __l_01._M_array = in_stack_ffffffffffffe720;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              *)in_stack_ffffffffffffe718,__l_01,(allocator_type *)in_stack_ffffffffffffe710);
    HelpExampleCliNamed(in_stack_ffffffffffffe730,(RPCArgList *)in_stack_ffffffffffffe728);
    in_stack_ffffffffffffe6e8 = "\"> bitcoin-cli -named test foo=\'b\\\"ar\'\\n\"";
    in_stack_ffffffffffffe6e0 = "> bitcoin-cli -named test foo=\'b\"ar\'\n";
    in_stack_ffffffffffffe6d8 = "HelpExampleCliNamed(\"test\", {{\"foo\", \"b\\\"ar\"}})";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[38]>
              (local_ec8,local_ed8,0x231,1,2,local_2c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *)in_stack_ffffffffffffe6e8);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                  *)in_stack_ffffffffffffe6d8);
    local_14d8 = local_2e8;
    do {
      local_14d8 = local_14d8 + -0x78;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
               *)in_stack_ffffffffffffe6d8);
    } while (local_14d8 != local_360);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::allocator<char>::~allocator(&local_ed9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe718,
               (const_string *)in_stack_ffffffffffffe710,in_stack_ffffffffffffe708,
               in_stack_ffffffffffffe700);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6e0,(char (*) [1])in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
               (allocator<char> *)in_stack_ffffffffffffe718);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::pair<const_char_(&)[4],_const_char_(&)[5],_true>
              (in_stack_ffffffffffffe720,(char (*) [4])in_stack_ffffffffffffe718,
               (char (*) [5])in_stack_ffffffffffffe710);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                 *)in_stack_ffffffffffffe6d8);
    __l_02._M_len = (size_type)in_stack_ffffffffffffe728;
    __l_02._M_array = in_stack_ffffffffffffe720;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              *)in_stack_ffffffffffffe718,__l_02,(allocator_type *)in_stack_ffffffffffffe710);
    HelpExampleCliNamed(in_stack_ffffffffffffe730,(RPCArgList *)in_stack_ffffffffffffe728);
    in_stack_ffffffffffffe6e8 = "\"> bitcoin-cli -named test foo=\'b ar\'\\n\"";
    in_stack_ffffffffffffe6e0 = "> bitcoin-cli -named test foo=\'b ar\'\n";
    in_stack_ffffffffffffe6d8 = "HelpExampleCliNamed(\"test\", {{\"foo\", \"b ar\"}})";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[38]>
              (local_f40,local_f50,0x232,1,2,local_380);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *)in_stack_ffffffffffffe6e8);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                  *)in_stack_ffffffffffffe6d8);
    local_1518 = local_3a0;
    do {
      local_1518 = local_1518 + -0x78;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
               *)in_stack_ffffffffffffe6d8);
    } while (local_1518 != local_418);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::allocator<char>::~allocator(&local_f51);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0));
  UniValue::UniValue(in_stack_ffffffffffffe6f8,in_stack_ffffffffffffe6f4,
                     (string *)in_stack_ffffffffffffe6e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
             (allocator<char> *)in_stack_ffffffffffffe718);
  UniValue::UniValue<const_char_(&)[4],_char[4],_true>
            ((UniValue *)in_stack_ffffffffffffe720,(char (*) [4])in_stack_ffffffffffffe718);
  UniValue::pushKV((UniValue *)in_stack_ffffffffffffe720,(string *)in_stack_ffffffffffffe718,
                   in_stack_ffffffffffffe710);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6d8);
  std::allocator<char>::~allocator(local_f72);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
             (allocator<char> *)in_stack_ffffffffffffe718);
  local_f74 = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe718,(bool *)in_stack_ffffffffffffe710);
  UniValue::pushKV((UniValue *)in_stack_ffffffffffffe720,(string *)in_stack_ffffffffffffe718,
                   in_stack_ffffffffffffe710);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6d8);
  std::allocator<char>::~allocator(&local_f73);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
             (allocator<char> *)in_stack_ffffffffffffe718);
  local_f7c = 1;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffe718,(int *)in_stack_ffffffffffffe710);
  UniValue::pushKV((UniValue *)in_stack_ffffffffffffe720,(string *)in_stack_ffffffffffffe718,
                   in_stack_ffffffffffffe710);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6d8);
  std::allocator<char>::~allocator(&local_f75);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe718,
               (const_string *)in_stack_ffffffffffffe710,in_stack_ffffffffffffe708,
               in_stack_ffffffffffffe700);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6e0,(char (*) [1])in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
               (allocator<char> *)in_stack_ffffffffffffe718);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::pair<const_char_(&)[5],_UniValue_&,_true>
              (in_stack_ffffffffffffe720,(char (*) [5])in_stack_ffffffffffffe718,
               in_stack_ffffffffffffe710);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                 *)in_stack_ffffffffffffe6d8);
    __l_03._M_len = (size_type)in_stack_ffffffffffffe728;
    __l_03._M_array = in_stack_ffffffffffffe720;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              *)in_stack_ffffffffffffe718,__l_03,(allocator_type *)in_stack_ffffffffffffe710);
    HelpExampleCliNamed(in_stack_ffffffffffffe730,(RPCArgList *)in_stack_ffffffffffffe728);
    in_stack_ffffffffffffe6e8 =
         "\"> bitcoin-cli -named test name=\'{\\\"foo\\\":\\\"bar\\\",\\\"b\\\":false,\\\"n\\\":1}\'\\n\""
    ;
    in_stack_ffffffffffffe6e0 =
         "> bitcoin-cli -named test name=\'{\"foo\":\"bar\",\"b\":false,\"n\":1}\'\n";
    in_stack_ffffffffffffe6d8 = "HelpExampleCliNamed(\"test\", {{\"name\", obj_value}})";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[64]>
              (local_fc0,local_fd0,0x239,1,2,local_618);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *)in_stack_ffffffffffffe6e8);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                  *)in_stack_ffffffffffffe6d8);
    local_1578 = local_638;
    do {
      local_1578 = local_1578 + -0x78;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
               *)in_stack_ffffffffffffe6d8);
    } while (local_1578 != local_6b0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::allocator<char>::~allocator(&local_fd1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe718,
               (const_string *)in_stack_ffffffffffffe710,in_stack_ffffffffffffe708,
               in_stack_ffffffffffffe700);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6e0,(char (*) [1])in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
               (allocator<char> *)in_stack_ffffffffffffe718);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::pair<const_char_(&)[5],_UniValue_&,_true>
              (in_stack_ffffffffffffe720,(char (*) [5])in_stack_ffffffffffffe718,
               in_stack_ffffffffffffe710);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                 *)in_stack_ffffffffffffe6d8);
    __l_04._M_len = (size_type)in_stack_ffffffffffffe728;
    __l_04._M_array = in_stack_ffffffffffffe720;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              *)in_stack_ffffffffffffe718,__l_04,(allocator_type *)in_stack_ffffffffffffe710);
    HelpExampleRpcNamed(&in_stack_ffffffffffffe720->first,(RPCArgList *)in_stack_ffffffffffffe718);
    in_stack_ffffffffffffe6e8 =
         "\"> curl --user myusername --data-binary \'{\\\"jsonrpc\\\": \\\"2.0\\\", \\\"id\\\": \\\"curltest\\\", \\\"method\\\": \\\"test\\\", \\\"params\\\": {\\\"name\\\":{\\\"foo\\\":\\\"bar\\\",\\\"b\\\":false,\\\"n\\\":1}}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\\n\""
    ;
    in_stack_ffffffffffffe6e0 =
         "> curl --user myusername --data-binary \'{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"name\":{\"foo\":\"bar\",\"b\":false,\"n\":1}}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\n"
    ;
    in_stack_ffffffffffffe6d8 = "HelpExampleRpcNamed(\"test\", {{\"name\", obj_value}})";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[206]>
              (local_1038,local_1048,0x23a,1,2,local_6d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *)in_stack_ffffffffffffe6e8);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                  *)in_stack_ffffffffffffe6d8);
    local_15b8 = local_6f0;
    do {
      local_15b8 = local_15b8 + -0x78;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
               *)in_stack_ffffffffffffe6d8);
    } while (local_15b8 != local_768);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::allocator<char>::~allocator(&local_1049);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0));
  UniValue::UniValue(in_stack_ffffffffffffe6f8,in_stack_ffffffffffffe6f4,
                     (string *)in_stack_ffffffffffffe6e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe6d8);
  UniValue::UniValue<const_char_(&)[4],_char[4],_true>
            ((UniValue *)in_stack_ffffffffffffe720,(char (*) [4])in_stack_ffffffffffffe718);
  UniValue::push_back((UniValue *)CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
                      (UniValue *)in_stack_ffffffffffffe6e8);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6d8);
  local_106a = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe718,(bool *)in_stack_ffffffffffffe710);
  UniValue::push_back((UniValue *)CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
                      (UniValue *)in_stack_ffffffffffffe6e8);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6d8);
  local_1070 = 1;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffe718,(int *)in_stack_ffffffffffffe710);
  UniValue::push_back((UniValue *)CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
                      (UniValue *)in_stack_ffffffffffffe6e8);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6d8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe718,
               (const_string *)in_stack_ffffffffffffe710,in_stack_ffffffffffffe708,
               in_stack_ffffffffffffe700);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6e0,(char (*) [1])in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
               (allocator<char> *)in_stack_ffffffffffffe718);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::pair<const_char_(&)[5],_UniValue_&,_true>
              (in_stack_ffffffffffffe720,(char (*) [5])in_stack_ffffffffffffe718,
               in_stack_ffffffffffffe710);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                 *)in_stack_ffffffffffffe6d8);
    __l_05._M_len = (size_type)in_stack_ffffffffffffe728;
    __l_05._M_array = in_stack_ffffffffffffe720;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              *)in_stack_ffffffffffffe718,__l_05,(allocator_type *)in_stack_ffffffffffffe710);
    HelpExampleCliNamed(in_stack_ffffffffffffe730,(RPCArgList *)in_stack_ffffffffffffe728);
    in_stack_ffffffffffffe6e8 = "\"> bitcoin-cli -named test name=\'[\\\"bar\\\",false,1]\'\\n\"";
    in_stack_ffffffffffffe6e0 = "> bitcoin-cli -named test name=\'[\"bar\",false,1]\'\n";
    in_stack_ffffffffffffe6d8 = "HelpExampleCliNamed(\"test\", {{\"name\", arr_value}})";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[50]>
              (local_10b0,local_10c0,0x241,1,2,local_908);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *)in_stack_ffffffffffffe6e8);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                  *)in_stack_ffffffffffffe6d8);
    local_1600 = local_928;
    do {
      local_1600 = local_1600 + -0x78;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
               *)in_stack_ffffffffffffe6d8);
    } while (local_1600 != local_9a0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::allocator<char>::~allocator(&local_10c1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe718,
               (const_string *)in_stack_ffffffffffffe710,in_stack_ffffffffffffe708,
               in_stack_ffffffffffffe700);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6e0,(char (*) [1])in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
               (allocator<char> *)in_stack_ffffffffffffe718);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::pair<const_char_(&)[5],_UniValue_&,_true>
              (in_stack_ffffffffffffe720,(char (*) [5])in_stack_ffffffffffffe718,
               in_stack_ffffffffffffe710);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                 *)in_stack_ffffffffffffe6d8);
    __l_06._M_len = (size_type)in_stack_ffffffffffffe728;
    __l_06._M_array = in_stack_ffffffffffffe720;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              *)in_stack_ffffffffffffe718,__l_06,(allocator_type *)in_stack_ffffffffffffe710);
    HelpExampleRpcNamed(&in_stack_ffffffffffffe720->first,(RPCArgList *)in_stack_ffffffffffffe718);
    in_stack_ffffffffffffe6e8 =
         "\"> curl --user myusername --data-binary \'{\\\"jsonrpc\\\": \\\"2.0\\\", \\\"id\\\": \\\"curltest\\\", \\\"method\\\": \\\"test\\\", \\\"params\\\": {\\\"name\\\":[\\\"bar\\\",false,1]}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\\n\""
    ;
    in_stack_ffffffffffffe6e0 =
         "> curl --user myusername --data-binary \'{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"name\":[\"bar\",false,1]}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\n"
    ;
    in_stack_ffffffffffffe6d8 = "HelpExampleRpcNamed(\"test\", {{\"name\", arr_value}})";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[192]>
              (local_1128,local_1138,0x242,1,2,local_9c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *)in_stack_ffffffffffffe6e8);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                  *)in_stack_ffffffffffffe6d8);
    local_1640 = local_9e0;
    do {
      local_1640 = local_1640 + -0x78;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
               *)in_stack_ffffffffffffe6d8);
    } while (local_1640 != local_a58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::allocator<char>::~allocator(&local_1139);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe718,
               (const_string *)in_stack_ffffffffffffe710,in_stack_ffffffffffffe708,
               in_stack_ffffffffffffe700);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6e0,(char (*) [1])in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
               (allocator<char> *)in_stack_ffffffffffffe718);
    local_11d1 = 1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::pair<const_char_(&)[4],_bool,_true>
              (in_stack_ffffffffffffe720,(char (*) [4])in_stack_ffffffffffffe718,
               (bool *)in_stack_ffffffffffffe710);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                 *)in_stack_ffffffffffffe6d8);
    __l_07._M_len = (size_type)in_stack_ffffffffffffe728;
    __l_07._M_array = in_stack_ffffffffffffe720;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              *)in_stack_ffffffffffffe718,__l_07,(allocator_type *)in_stack_ffffffffffffe710);
    HelpExampleCliNamed(in_stack_ffffffffffffe730,(RPCArgList *)in_stack_ffffffffffffe728);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
               (allocator<char> *)in_stack_ffffffffffffe718);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::pair<const_char_(&)[4],_const_char_(&)[5],_true>
              (in_stack_ffffffffffffe720,(char (*) [4])in_stack_ffffffffffffe718,
               (char (*) [5])in_stack_ffffffffffffe710);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                 *)in_stack_ffffffffffffe6d8);
    __l_08._M_len = (size_type)in_stack_ffffffffffffe728;
    __l_08._M_array = in_stack_ffffffffffffe720;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              *)in_stack_ffffffffffffe718,__l_08,(allocator_type *)in_stack_ffffffffffffe710);
    HelpExampleCliNamed(in_stack_ffffffffffffe730,(RPCArgList *)in_stack_ffffffffffffe728);
    in_stack_ffffffffffffe6e8 = "HelpExampleCliNamed(\"foo\", {{\"arg\", \"true\"}})";
    in_stack_ffffffffffffe6e0 = (char *)local_b30;
    in_stack_ffffffffffffe6d8 = "HelpExampleCliNamed(\"foo\", {{\"arg\", true}})";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_11a0,local_11b0,0x245,1,2,local_a78);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *)in_stack_ffffffffffffe6e8);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                  *)in_stack_ffffffffffffe6d8);
    local_1690 = local_b50;
    do {
      local_1690 = local_1690 + -0x78;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
               *)in_stack_ffffffffffffe6d8);
    } while (local_1690 != local_bc8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::allocator<char>::~allocator(local_11d3);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *)in_stack_ffffffffffffe6e8);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                  *)in_stack_ffffffffffffe6d8);
    local_16a8 = local_a98;
    do {
      local_16a8 = local_16a8 + -0x78;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
               *)in_stack_ffffffffffffe6d8);
    } while (local_16a8 != local_b10);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::allocator<char>::~allocator(&local_11b1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe718,
               (const_string *)in_stack_ffffffffffffe710,in_stack_ffffffffffffe708,
               in_stack_ffffffffffffe700);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe6e0,(char (*) [1])in_stack_ffffffffffffe6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
               (unsigned_long)in_stack_ffffffffffffe6d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
               (allocator<char> *)in_stack_ffffffffffffe718);
    local_1269 = 1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::pair<const_char_(&)[4],_bool,_true>
              (in_stack_ffffffffffffe720,(char (*) [4])in_stack_ffffffffffffe718,
               (bool *)in_stack_ffffffffffffe710);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                 *)in_stack_ffffffffffffe6d8);
    __l_09._M_len = (size_type)in_stack_ffffffffffffe728;
    __l_09._M_array = in_stack_ffffffffffffe720;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              *)in_stack_ffffffffffffe718,__l_09,(allocator_type *)in_stack_ffffffffffffe710);
    HelpExampleRpcNamed(&in_stack_ffffffffffffe720->first,(RPCArgList *)in_stack_ffffffffffffe718);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe728,(char *)in_stack_ffffffffffffe720,
               (allocator<char> *)in_stack_ffffffffffffe718);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::pair<const_char_(&)[4],_const_char_(&)[5],_true>
              (in_stack_ffffffffffffe720,(char (*) [4])in_stack_ffffffffffffe718,
               (char (*) [5])in_stack_ffffffffffffe710);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                 *)in_stack_ffffffffffffe6d8);
    __l_10._M_len = (size_type)in_stack_ffffffffffffe728;
    __l_10._M_array = in_stack_ffffffffffffe720;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              *)in_stack_ffffffffffffe718,__l_10,(allocator_type *)in_stack_ffffffffffffe710);
    HelpExampleRpcNamed(&in_stack_ffffffffffffe720->first,(RPCArgList *)in_stack_ffffffffffffe718);
    in_stack_ffffffffffffe6e8 = "HelpExampleRpcNamed(\"foo\", {{\"arg\", \"true\"}})";
    in_stack_ffffffffffffe6e0 = (char *)local_ca0;
    in_stack_ffffffffffffe6d8 = "HelpExampleRpcNamed(\"foo\", {{\"arg\", true}})";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,std::__cxx11::string,std::__cxx11::string>
              (local_1238,local_1248,0x248,1,3,local_be8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *)in_stack_ffffffffffffe6e8);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                  *)in_stack_ffffffffffffe6d8);
    local_16f8 = local_cc0;
    do {
      local_16f8 = local_16f8 + -0x78;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
               *)in_stack_ffffffffffffe6d8);
    } while (local_16f8 != local_d38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::allocator<char>::~allocator(local_126b);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *)in_stack_ffffffffffffe6e8);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                  *)in_stack_ffffffffffffe6d8);
    local_1710 = local_c08;
    do {
      local_1710 = local_1710 + -0x78;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
               *)in_stack_ffffffffffffe6d8);
    } while (local_1710 != local_c80);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe6d8);
    std::allocator<char>::~allocator(&local_1249);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe6d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6d8);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe6d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)in_stack_ffffffffffffe6e8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(help_example)
{
    // test different argument types
    const RPCArgList& args = {{"foo", "bar"}, {"b", true}, {"n", 1}};
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", args), "> bitcoin-cli -named test foo=bar b=true n=1\n");
    BOOST_CHECK_EQUAL(HelpExampleRpcNamed("test", args), "> curl --user myusername --data-binary '{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"foo\":\"bar\",\"b\":true,\"n\":1}}' -H 'content-type: application/json' http://127.0.0.1:8332/\n");

    // test shell escape
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"foo", "b'ar"}}), "> bitcoin-cli -named test foo='b'''ar'\n");
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"foo", "b\"ar"}}), "> bitcoin-cli -named test foo='b\"ar'\n");
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"foo", "b ar"}}), "> bitcoin-cli -named test foo='b ar'\n");

    // test object params
    UniValue obj_value(UniValue::VOBJ);
    obj_value.pushKV("foo", "bar");
    obj_value.pushKV("b", false);
    obj_value.pushKV("n", 1);
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"name", obj_value}}), "> bitcoin-cli -named test name='{\"foo\":\"bar\",\"b\":false,\"n\":1}'\n");
    BOOST_CHECK_EQUAL(HelpExampleRpcNamed("test", {{"name", obj_value}}), "> curl --user myusername --data-binary '{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"name\":{\"foo\":\"bar\",\"b\":false,\"n\":1}}}' -H 'content-type: application/json' http://127.0.0.1:8332/\n");

    // test array params
    UniValue arr_value(UniValue::VARR);
    arr_value.push_back("bar");
    arr_value.push_back(false);
    arr_value.push_back(1);
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"name", arr_value}}), "> bitcoin-cli -named test name='[\"bar\",false,1]'\n");
    BOOST_CHECK_EQUAL(HelpExampleRpcNamed("test", {{"name", arr_value}}), "> curl --user myusername --data-binary '{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"name\":[\"bar\",false,1]}}' -H 'content-type: application/json' http://127.0.0.1:8332/\n");

    // test types don't matter for shell
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("foo", {{"arg", true}}), HelpExampleCliNamed("foo", {{"arg", "true"}}));

    // test types matter for Rpc
    BOOST_CHECK_NE(HelpExampleRpcNamed("foo", {{"arg", true}}), HelpExampleRpcNamed("foo", {{"arg", "true"}}));
}